

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

void __thiscall (anonymous_namespace)::RW::~RW(RW *this)

{
  anon_unknown.dwarf_1acb919::RW::~RW((RW *)(this + -8));
  return;
}

Assistant:

RW(const std::shared_ptr<Reader>& r, const std::shared_ptr<Writer>& w)
      : r(r), w(w) {}